

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

uint runcpsav(runcxdef *ctx,uchar **cp,objnum obj,prpnum prop)

{
  mcmcx1def *pmVar1;
  undefined8 uVar2;
  ushort in_DX;
  mcmcxdef *in_RSI;
  long in_RDI;
  uint ofs;
  
  pmVar1 = in_RSI->mcmcxgl;
  uVar2 = *(undefined8 *)
           (*(long *)(*(long *)**(undefined8 **)(in_RDI + 8) +
                     (long)((int)(uint)*(ushort *)
                                        (*(long *)(*(long *)(in_RDI + 8) + 0x30 +
                                                  (long)((int)(uint)in_DX >> 8) * 8) +
                                        (long)(int)(in_DX & 0xff) * 2) >> 8) * 8) +
           (long)(int)(*(ushort *)
                        (*(long *)(*(long *)(in_RDI + 8) + 0x30 + (long)((int)(uint)in_DX >> 8) * 8)
                        + (long)(int)(in_DX & 0xff) * 2) & 0xff) * 0x20);
  in_RSI->mcmcxgl = (mcmcx1def *)0x0;
  mcmunlck(in_RSI,in_DX);
  return (int)pmVar1 - (int)uVar2;
}

Assistant:

static uint runcpsav(runcxdef *ctx, uchar *noreg *cp, objnum obj, prpnum prop)
{
    uint ofs;

    VARUSED(prop);
    
    /* get offset from start of object */
    ofs = *cp - mcmobjptr(ctx->runcxmem, (mcmon)obj);

    /* clear the pointer so the caller knows the object is unlocked */
    *cp = 0;

    /* unlock the object, and return the derived offset */
    mcmunlck(ctx->runcxmem, (mcmon)obj);
    return(ofs);
}